

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O0

void ReadRegTestArgs(ArgsManager *args,RegTestOptions *options)

{
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view source_file;
  string_view name;
  string_view logging_function;
  int iVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  bool *pbVar5;
  size_type sVar6;
  runtime_error *prVar7;
  mapped_type *pmVar8;
  long in_RSI;
  long in_FS_OFFSET;
  int j;
  bool found_1;
  string *strDeployment;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  size_type found;
  string *arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  VersionBitsParameters vbparams;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vDeploymentParams;
  iterator __end1_1;
  iterator __begin1_1;
  optional<Consensus::BuriedDeployment> buried_deployment;
  int32_t height;
  iterator __end1;
  iterator __begin1;
  optional<bool> value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> deployment_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value_1;
  undefined4 in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb7c;
  char *in_stack_fffffffffffffb80;
  reference in_stack_fffffffffffffb88;
  undefined7 in_stack_fffffffffffffb90;
  char in_stack_fffffffffffffb97;
  string *in_stack_fffffffffffffb98;
  ArgsManager *in_stack_fffffffffffffba0;
  ArgsManager *in_stack_fffffffffffffba8;
  size_t in_stack_fffffffffffffbb0;
  ArgsManager *in_stack_fffffffffffffbb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbc0;
  undefined7 in_stack_fffffffffffffbc8;
  char in_stack_fffffffffffffbcf;
  LogFlags in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe8;
  int in_stack_fffffffffffffbec;
  ArgsManager *in_stack_fffffffffffffbf0;
  ConstevalFormatString<4U> fmt;
  undefined8 in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc38;
  int in_stack_fffffffffffffc3c;
  char *in_stack_fffffffffffffc40;
  mapped_type *in_stack_fffffffffffffc48;
  int local_358;
  __sv_type in_stack_fffffffffffffd18;
  __sv_type in_stack_fffffffffffffd30;
  undefined7 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd47;
  int *in_stack_fffffffffffffd48;
  int64_t local_258;
  undefined1 auStack_250 [8];
  undefined1 local_248 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_218;
  allocator<char> local_209 [32];
  allocator<char> local_1e9;
  _Optional_payload_base<Consensus::BuriedDeployment> local_1e8;
  int local_1e4;
  _Base_ptr local_1e0;
  _Base_ptr local_1d8;
  allocator<char> local_1c9 [30];
  allocator<char> local_1ab;
  _Optional_payload_base<bool> local_1aa;
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [96];
  string local_e8 [64];
  string local_a8 [64];
  string local_68 [96];
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> local_8;
  
  local_8._M_head_impl =
       *(_Impl **)
        &((__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
           *)(in_FS_OFFSET + 0x28))->
         super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8),
             (char *)in_stack_fffffffffffffbc0,(allocator<char> *)in_stack_fffffffffffffbb8);
  local_1aa = (_Optional_payload_base<bool>)
              ArgsManager::GetBoolArg(in_stack_fffffffffffffba8,(string *)in_stack_fffffffffffffba0)
  ;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  std::allocator<char>::~allocator(&local_1ab);
  bVar2 = std::optional::operator_cast_to_bool
                    ((optional<bool> *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78)
                    );
  if (bVar2) {
    pbVar5 = std::optional<bool>::operator*
                       ((optional<bool> *)
                        CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    *(byte *)(in_RSI + 0x70) = *pbVar5 & 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8),
             (char *)in_stack_fffffffffffffbc0,(allocator<char> *)in_stack_fffffffffffffbb8);
  ArgsManager::GetArgs
            (in_stack_fffffffffffffbf0,
             (string *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  std::allocator<char>::~allocator(local_1c9);
  local_1d8 = (_Base_ptr)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffb80);
  local_1e0 = (_Base_ptr)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffb80);
  while (bVar2 = __gnu_cxx::
                 operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffb88,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffb80), ((bVar2 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    in_stack_fffffffffffffd48 =
         (int *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbcf,
                     (size_type)in_stack_fffffffffffffbb8);
    if (in_stack_fffffffffffffd48 == (int *)0xffffffffffffffff) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      tinyformat::format<std::__cxx11::string>
                ((char *)in_stack_fffffffffffffba8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffba0);
      std::runtime_error::runtime_error(prVar7,local_68);
      if (*(_Impl **)(in_FS_OFFSET + 0x28) == local_8._M_head_impl) {
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_018ee4eb;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffba0,(size_type)in_stack_fffffffffffffb98,
               CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
    in_stack_fffffffffffffd30 =
         std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffb98);
    str._M_len._7_1_ = in_stack_fffffffffffffb97;
    str._M_len._0_7_ = in_stack_fffffffffffffb90;
    str._M_str = (char *)in_stack_fffffffffffffb98;
    bVar2 = ParseInt32(str,(int32_t *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78))
    ;
    iVar1 = local_1e4;
    if (((!bVar2) || (local_1e4 < 0)) || (iVar4 = std::numeric_limits<int>::max(), iVar4 <= iVar1))
    {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      tinyformat::format<std::__cxx11::string>
                ((char *)in_stack_fffffffffffffba8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffba0);
      std::runtime_error::runtime_error(prVar7,local_a8);
      if (*(_Impl **)(in_FS_OFFSET + 0x28) == local_8._M_head_impl) {
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_018ee4eb;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffba0,(size_type)in_stack_fffffffffffffb98,
               CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
    in_stack_fffffffffffffd18 =
         std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffb98);
    name._M_len._4_4_ = in_stack_fffffffffffffc3c;
    name._M_len._0_4_ = in_stack_fffffffffffffc38;
    name._M_str = in_stack_fffffffffffffc40;
    local_1e8 = (_Optional_payload_base<Consensus::BuriedDeployment>)GetBuriedDeployment(name);
    bVar2 = std::optional::operator_cast_to_bool
                      ((optional<Consensus::BuriedDeployment> *)
                       CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    if (!bVar2) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      tinyformat::format<std::__cxx11::string>
                ((char *)in_stack_fffffffffffffba8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffba0);
      std::runtime_error::runtime_error(prVar7,local_e8);
      if (*(_Impl **)(in_FS_OFFSET + 0x28) == local_8._M_head_impl) {
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_018ee4eb;
    }
    in_stack_fffffffffffffc40 = (char *)(in_RSI + 0x38);
    in_stack_fffffffffffffc3c = local_1e4;
    std::optional<Consensus::BuriedDeployment>::operator*
              ((optional<Consensus::BuriedDeployment> *)
               CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    in_stack_fffffffffffffc48 =
         std::
         unordered_map<Consensus::BuriedDeployment,_int,_std::hash<Consensus::BuriedDeployment>,_std::equal_to<Consensus::BuriedDeployment>,_std::allocator<std::pair<const_Consensus::BuriedDeployment,_int>_>_>
         ::operator[]((unordered_map<Consensus::BuriedDeployment,_int,_std::hash<Consensus::BuriedDeployment>,_std::equal_to<Consensus::BuriedDeployment>,_std::allocator<std::pair<const_Consensus::BuriedDeployment,_int>_>_>
                       *)in_stack_fffffffffffffb88,(key_type *)in_stack_fffffffffffffb80);
    *in_stack_fffffffffffffc48 = in_stack_fffffffffffffc3c;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffb88);
  fmt.fmt = (char *)&local_1e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8),
             (char *)in_stack_fffffffffffffbc0,(allocator<char> *)in_stack_fffffffffffffbb8);
  bVar2 = ArgsManager::IsArgSet(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  std::allocator<char>::~allocator(&local_1e9);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8),
               (char *)in_stack_fffffffffffffbc0,(allocator<char> *)in_stack_fffffffffffffbb8);
    ArgsManager::GetArgs
              (in_stack_fffffffffffffbf0,
               (string *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    std::allocator<char>::~allocator(local_209);
    local_218 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffb80);
    local_248._40_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffb80);
    while (bVar2 = __gnu_cxx::
                   operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffb88,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffb80), ((bVar2 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffb98);
      str_03._M_str = (char *)in_stack_fffffffffffffbb8;
      str_03._M_len = in_stack_fffffffffffffbb0;
      util::SplitString_abi_cxx11_(str_03,in_stack_fffffffffffffb97);
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
      if ((sVar6 < 3) ||
         (sVar6 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78)),
         4 < sVar6)) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar7,
                   "Version bits parameters malformed, expecting deployment:start:end[:min_activation_height]"
                  );
        if (*(_Impl **)(in_FS_OFFSET + 0x28) == local_8._M_head_impl) {
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_018ee4eb;
      }
      local_258 = 0;
      auStack_250 = (undefined1  [8])0x0;
      local_248._0_8_ = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffb88,(size_type)in_stack_fffffffffffffb80);
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffb98);
      str_00._M_len._7_1_ = in_stack_fffffffffffffb97;
      str_00._M_len._0_7_ = in_stack_fffffffffffffb90;
      str_00._M_str = (char *)in_stack_fffffffffffffb98;
      bVar2 = ParseInt64(str_00,(int64_t *)
                                CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
      if (!bVar2) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffb88,(size_type)in_stack_fffffffffffffb80);
        tinyformat::format<std::__cxx11::string>
                  ((char *)in_stack_fffffffffffffba8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffba0);
        std::runtime_error::runtime_error(prVar7,local_148);
        if (*(_Impl **)(in_FS_OFFSET + 0x28) == local_8._M_head_impl) {
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_018ee4eb;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffb88,(size_type)in_stack_fffffffffffffb80);
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffb98);
      str_01._M_len._7_1_ = in_stack_fffffffffffffb97;
      str_01._M_len._0_7_ = in_stack_fffffffffffffb90;
      str_01._M_str = (char *)in_stack_fffffffffffffb98;
      bVar2 = ParseInt64(str_01,(int64_t *)
                                CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
      in_stack_fffffffffffffbec = CONCAT13(bVar2,(int3)in_stack_fffffffffffffbec);
      if (!bVar2) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffb88,(size_type)in_stack_fffffffffffffb80);
        tinyformat::format<std::__cxx11::string>
                  ((char *)in_stack_fffffffffffffba8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffba0);
        std::runtime_error::runtime_error(prVar7,local_168);
        if (*(_Impl **)(in_FS_OFFSET + 0x28) == local_8._M_head_impl) {
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_018ee4eb;
      }
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
      if (sVar6 < 4) {
        local_248._0_8_ = local_248._0_8_ & 0xffffffff00000000;
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffb88,(size_type)in_stack_fffffffffffffb80);
        std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffb98);
        str_02._M_len._7_1_ = in_stack_fffffffffffffb97;
        str_02._M_len._0_7_ = in_stack_fffffffffffffb90;
        str_02._M_str = (char *)in_stack_fffffffffffffb98;
        bVar2 = ParseInt32(str_02,(int32_t *)
                                  CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
        if (!bVar2) {
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffb88,(size_type)in_stack_fffffffffffffb80);
          tinyformat::format<std::__cxx11::string>
                    ((char *)in_stack_fffffffffffffba8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffba0);
          std::runtime_error::runtime_error(prVar7,local_188);
          if (*(_Impl **)(in_FS_OFFSET + 0x28) == local_8._M_head_impl) {
            __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_018ee4eb;
        }
      }
      bVar2 = false;
      for (local_358 = 0; local_358 < 2; local_358 = local_358 + 1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffb88,(size_type)in_stack_fffffffffffffb80);
        bVar3 = std::operator==(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
        if (bVar3) {
          pmVar8 = std::
                   unordered_map<Consensus::DeploymentPos,_CChainParams::VersionBitsParameters,_std::hash<Consensus::DeploymentPos>,_std::equal_to<Consensus::DeploymentPos>,_std::allocator<std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>_>_>
                   ::operator[]((unordered_map<Consensus::DeploymentPos,_CChainParams::VersionBitsParameters,_std::hash<Consensus::DeploymentPos>,_std::equal_to<Consensus::DeploymentPos>,_std::allocator<std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>_>_>
                                 *)in_stack_fffffffffffffb88,(key_type *)in_stack_fffffffffffffb80);
          *(undefined8 *)&pmVar8->min_activation_height = local_248._0_8_;
          pmVar8->start_time = local_258;
          pmVar8->timeout = (int64_t)auStack_250;
          in_stack_fffffffffffffba0 = (ArgsManager *)local_248;
          bVar2 = true;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb98,
                     (char *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb98,
                     (char *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
          in_stack_fffffffffffffb88 =
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_fffffffffffffb88,(size_type)in_stack_fffffffffffffb80);
          in_stack_fffffffffffffb98 = (string *)auStack_250;
          in_stack_fffffffffffffb90 = SUB87(&local_258,0);
          in_stack_fffffffffffffb97 = (char)((ulong)&local_258 >> 0x38);
          in_stack_fffffffffffffb80 =
               "Setting version bits activation parameters for %s to start=%ld, timeout=%ld, min_activation_height=%d\n"
          ;
          in_stack_fffffffffffffb78 = 2;
          logging_function._M_str = (char *)in_stack_fffffffffffffc48;
          logging_function._M_len = (size_t)in_stack_fffffffffffffc40;
          source_file._M_str._0_4_ = in_stack_fffffffffffffc38;
          source_file._M_len = in_stack_fffffffffffffc30;
          source_file._M_str._4_4_ = in_stack_fffffffffffffc3c;
          in_stack_fffffffffffffbb8 = in_stack_fffffffffffffba0;
          LogPrintFormatInternal<std::__cxx11::string,long,long,int>
                    (logging_function,source_file,in_stack_fffffffffffffbec,
                     in_stack_fffffffffffffbe0,(Level)in_stack_fffffffffffffd18._M_str,fmt,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd30._M_len,(long *)in_stack_fffffffffffffd30._M_str,
                     (long *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                     in_stack_fffffffffffffd48);
          break;
        }
      }
      if (!bVar2) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffb88,(size_type)in_stack_fffffffffffffb80);
        tinyformat::format<std::__cxx11::string>
                  ((char *)in_stack_fffffffffffffba8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffba0);
        std::runtime_error::runtime_error(prVar7,local_1a8);
        if (*(_Impl **)(in_FS_OFFSET + 0x28) == local_8._M_head_impl) {
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_018ee4eb;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffb88);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffb88);
  }
  if (*(_Impl **)(in_FS_OFFSET + 0x28) == local_8._M_head_impl) {
    return;
  }
LAB_018ee4eb:
  __stack_chk_fail();
}

Assistant:

void ReadRegTestArgs(const ArgsManager& args, CChainParams::RegTestOptions& options)
{
    if (auto value = args.GetBoolArg("-fastprune")) options.fastprune = *value;

    for (const std::string& arg : args.GetArgs("-testactivationheight")) {
        const auto found{arg.find('@')};
        if (found == std::string::npos) {
            throw std::runtime_error(strprintf("Invalid format (%s) for -testactivationheight=name@height.", arg));
        }

        const auto value{arg.substr(found + 1)};
        int32_t height;
        if (!ParseInt32(value, &height) || height < 0 || height >= std::numeric_limits<int>::max()) {
            throw std::runtime_error(strprintf("Invalid height value (%s) for -testactivationheight=name@height.", arg));
        }

        const auto deployment_name{arg.substr(0, found)};
        if (const auto buried_deployment = GetBuriedDeployment(deployment_name)) {
            options.activation_heights[*buried_deployment] = height;
        } else {
            throw std::runtime_error(strprintf("Invalid name (%s) for -testactivationheight=name@height.", arg));
        }
    }

    if (!args.IsArgSet("-vbparams")) return;

    for (const std::string& strDeployment : args.GetArgs("-vbparams")) {
        std::vector<std::string> vDeploymentParams = SplitString(strDeployment, ':');
        if (vDeploymentParams.size() < 3 || 4 < vDeploymentParams.size()) {
            throw std::runtime_error("Version bits parameters malformed, expecting deployment:start:end[:min_activation_height]");
        }
        CChainParams::VersionBitsParameters vbparams{};
        if (!ParseInt64(vDeploymentParams[1], &vbparams.start_time)) {
            throw std::runtime_error(strprintf("Invalid nStartTime (%s)", vDeploymentParams[1]));
        }
        if (!ParseInt64(vDeploymentParams[2], &vbparams.timeout)) {
            throw std::runtime_error(strprintf("Invalid nTimeout (%s)", vDeploymentParams[2]));
        }
        if (vDeploymentParams.size() >= 4) {
            if (!ParseInt32(vDeploymentParams[3], &vbparams.min_activation_height)) {
                throw std::runtime_error(strprintf("Invalid min_activation_height (%s)", vDeploymentParams[3]));
            }
        } else {
            vbparams.min_activation_height = 0;
        }
        bool found = false;
        for (int j=0; j < (int)Consensus::MAX_VERSION_BITS_DEPLOYMENTS; ++j) {
            if (vDeploymentParams[0] == VersionBitsDeploymentInfo[j].name) {
                options.version_bits_parameters[Consensus::DeploymentPos(j)] = vbparams;
                found = true;
                LogPrintf("Setting version bits activation parameters for %s to start=%ld, timeout=%ld, min_activation_height=%d\n", vDeploymentParams[0], vbparams.start_time, vbparams.timeout, vbparams.min_activation_height);
                break;
            }
        }
        if (!found) {
            throw std::runtime_error(strprintf("Invalid deployment (%s)", vDeploymentParams[0]));
        }
    }
}